

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

int lj_strfmt_putarg(lua_State *L,SBuf *sb,int arg,int retry)

{
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  SFormat sf;
  int32_t c;
  GCstr *pGVar6;
  cTValue *pcVar7;
  void *v;
  MSize len;
  long lVar8;
  uint64_t k;
  ulong uVar9;
  int iVar10;
  cTValue *o;
  int iVar11;
  lua_Number lVar12;
  FormatState fs;
  int local_58;
  FormatState local_50;
  
  pTVar1 = L->top;
  pTVar2 = L->base;
  pGVar6 = lj_lib_checkstr(L,arg);
  local_50.p = (uint8_t *)(pGVar6 + 1);
  local_50.e = (uint8_t *)((long)&pGVar6[1].nextgc.gcptr64 + (ulong)pGVar6->len);
LAB_0010fd22:
  do {
    while( true ) {
      iVar11 = arg;
      iVar10 = retry;
      sf = lj_strfmt_parse(&local_50);
      retry = iVar10;
      if (sf != 2) break;
      lj_buf_putmem(sb,local_50.str,local_50.len);
      arg = iVar11;
    }
    if (sf == 0) {
      return iVar10;
    }
    if (sf == 1) {
      pGVar6 = lj_str_new(L,local_50.str,(ulong)local_50.len);
      lj_err_callerv(L,LJ_ERR_STRFMT,pGVar6 + 1);
    }
    arg = iVar11 + 1;
    local_58 = (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
    if (local_58 <= iVar11) {
      lj_err_arg(L,arg,LJ_ERR_NOVAL);
    }
  } while (5 < (sf & 0xf) - 3);
  o = L->base + iVar11;
  switch(sf & 0xf) {
  case 3:
    if (((o->u64 & 0xffff800000000000) != 0xfffa800000000000) ||
       (uVar9 = o->u64 & 0x7fffffffffff, (ushort)(*(short *)(uVar9 + 10) - 0xdU) < 0xfffe)) {
      lVar12 = lj_lib_checknum(L,arg);
      lj_strfmt_putfnum_int(sb,sf,lVar12);
      goto LAB_0010fd22;
    }
LAB_0010ffcd:
    k = *(uint64_t *)(uVar9 + 0x10);
    break;
  case 4:
    if (((o->u64 & 0xffff800000000000) == 0xfffa800000000000) &&
       (uVar9 = o->u64 & 0x7fffffffffff, 0xfffd < (ushort)(*(short *)(uVar9 + 10) - 0xdU)))
    goto LAB_0010ffcd;
    lVar12 = lj_lib_checknum(L,arg);
    k = (uint64_t)
        (double)(~-(ulong)(lVar12 < 9.223372036854776e+18) &
                 (ulong)(lVar12 + -1.8446744073709552e+19) |
                (ulong)lVar12 & -(ulong)(lVar12 < 9.223372036854776e+18));
    break;
  case 5:
    lVar12 = lj_lib_checknum(L,arg);
    lj_strfmt_putfnum(sb,sf,lVar12);
    goto LAB_0010fd22;
  case 6:
    lVar8 = o->it64 >> 0x2f;
    if ((lVar8 != -5) &&
       (((lVar8 != -0xd || (*(char *)((o->it64 & 0x7fffffffffffU) + 10) != '\x03')) && (-1 < iVar10)
        ))) {
      pcVar7 = lj_meta_lookup(L,o,MM_tostring);
      if (pcVar7->u64 != 0xffffffffffffffff) {
        pcVar3 = L->top;
        L->top = pcVar3 + 1;
        *pcVar3 = *pcVar7;
        pcVar7 = L->top;
        L->top = pcVar7 + 1;
        *pcVar7 = *o;
        lua_call(L,1,1);
        pTVar4 = L->base;
        pTVar5 = L->top;
        L->top = pTVar5 + -1;
        pTVar4[iVar11] = pTVar5[-1];
        retry = 1;
        if (iVar10 < 2) goto LAB_0010fd22;
        o = pTVar4 + iVar11;
      }
    }
    uVar9 = o->u64;
    if ((long)uVar9 >> 0x2f == -5) {
      pGVar6 = (GCstr *)(uVar9 & 0x7fffffffffff);
      len = pGVar6->len;
LAB_0010ff1c:
      pGVar6 = pGVar6 + 1;
    }
    else {
      if (((long)uVar9 >> 0x2f != -0xd) ||
         (uVar9 = uVar9 & 0x7fffffffffff, *(char *)(uVar9 + 10) != '\x03')) {
        pGVar6 = lj_strfmt_obj(L,o);
        len = pGVar6->len;
        goto LAB_0010ff1c;
      }
      if ((SBuf *)(uVar9 + 0x30) == sb) {
        lj_err_arg(L,iVar11 + 2,LJ_ERR_BUFFER_SELF);
      }
      pGVar6 = *(GCstr **)(uVar9 + 0x58);
      len = *(int *)(uVar9 + 0x30) - (int)pGVar6;
    }
    if ((sf & 0x10) == 0) {
      strfmt_putfstrlen(sb,sf,(char *)pGVar6,len);
      retry = iVar10;
    }
    else {
      strfmt_putquotedlen(sb,(char *)pGVar6,len);
      retry = iVar10;
    }
    goto LAB_0010fd22;
  case 7:
    c = lj_lib_checkint(L,arg);
    lj_strfmt_putfchar(sb,sf,c);
    goto LAB_0010fd22;
  case 8:
    goto switchD_0010fd92_caseD_8;
  }
  lj_strfmt_putfxint(sb,sf,k);
  goto LAB_0010fd22;
switchD_0010fd92_caseD_8:
  v = lj_obj_ptr((global_State *)(L->glref).ptr64,o);
  lj_strfmt_putptr(sb,v);
  goto LAB_0010fd22;
}

Assistant:

int lj_strfmt_putarg(lua_State *L, SBuf *sb, int arg, int retry)
{
  int narg = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  FormatState fs;
  SFormat sf;
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    if (sf == STRFMT_LIT) {
      lj_buf_putmem(sb, fs.str, fs.len);
    } else if (sf == STRFMT_ERR) {
      lj_err_callerv(L, LJ_ERR_STRFMT,
		     strdata(lj_str_new(L, fs.str, fs.len)));
    } else {
      TValue *o = &L->base[arg++];
      if (arg > narg)
	lj_err_arg(L, arg, LJ_ERR_NOVAL);
      switch (STRFMT_TYPE(sf)) {
      case STRFMT_INT:
	if (tvisint(o)) {
	  int32_t k = intV(o);
	  if (sf == STRFMT_INT)
	    lj_strfmt_putint(sb, k);  /* Shortcut for plain %d. */
	  else
	    lj_strfmt_putfxint(sb, sf, k);
	  break;
	}
#if LJ_HASFFI
	if (tviscdata(o)) {
	  GCcdata *cd = cdataV(o);
	  if (cd->ctypeid == CTID_INT64 || cd->ctypeid == CTID_UINT64) {
	    lj_strfmt_putfxint(sb, sf, *(uint64_t *)cdataptr(cd));
	    break;
	  }
	}
#endif
	lj_strfmt_putfnum_int(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_UINT:
	if (tvisint(o)) {
	  lj_strfmt_putfxint(sb, sf, intV(o));
	  break;
	}
#if LJ_HASFFI
	if (tviscdata(o)) {
	  GCcdata *cd = cdataV(o);
	  if (cd->ctypeid == CTID_INT64 || cd->ctypeid == CTID_UINT64) {
	    lj_strfmt_putfxint(sb, sf, *(uint64_t *)cdataptr(cd));
	    break;
	  }
	}
#endif
	lj_strfmt_putfnum_uint(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_NUM:
	lj_strfmt_putfnum(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_STR: {
	MSize len;
	const char *s;
	cTValue *mo;
	if (LJ_UNLIKELY(!tvisstr(o) && !tvisbuf(o)) && retry >= 0 &&
	    !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
	  /* Call __tostring metamethod once. */
	  copyTV(L, L->top++, mo);
	  copyTV(L, L->top++, o);
	  lua_call(L, 1, 1);
	  o = &L->base[arg-1];  /* Stack may have been reallocated. */
	  copyTV(L, o, --L->top);  /* Replace inline for retry. */
	  if (retry < 2) {  /* Global buffer may have been overwritten. */
	    retry = 1;
	    break;
	  }
	}
	if (LJ_LIKELY(tvisstr(o))) {
	  len = strV(o)->len;
	  s = strVdata(o);
#if LJ_HASBUFFER
	} else if (tvisbuf(o)) {
	  SBufExt *sbx = bufV(o);
	  if (sbx == (SBufExt *)sb) lj_err_arg(L, arg+1, LJ_ERR_BUFFER_SELF);
	  len = sbufxlen(sbx);
	  s = sbx->r;
#endif
	} else {
	  GCstr *str = lj_strfmt_obj(L, o);
	  len = str->len;
	  s = strdata(str);
	}
	if ((sf & STRFMT_T_QUOTED))
	  strfmt_putquotedlen(sb, s, len);  /* No formatting. */
	else
	  strfmt_putfstrlen(sb, sf, s, len);
	break;
	}
      case STRFMT_CHAR:
	lj_strfmt_putfchar(sb, sf, lj_lib_checkint(L, arg));
	break;
      case STRFMT_PTR:  /* No formatting. */
	lj_strfmt_putptr(sb, lj_obj_ptr(G(L), o));
	break;
      default:
	lj_assertL(0, "bad string format type");
	break;
      }
    }
  }
  return retry;
}